

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

void __thiscall ExprTree::~ExprTree(ExprTree *this)

{
  OpTpl *this_00;
  pointer ppOVar1;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar2;
  ulong uVar3;
  
  if (this->outvn != (VarnodeTpl *)0x0) {
    operator_delete(this->outvn);
  }
  pvVar2 = this->ops;
  if (pvVar2 != (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
    ppOVar1 = (pvVar2->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pvVar2->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppOVar1) {
      uVar3 = 0;
      do {
        this_00 = ppOVar1[uVar3];
        if (this_00 != (OpTpl *)0x0) {
          OpTpl::~OpTpl(this_00);
        }
        operator_delete(this_00);
        uVar3 = uVar3 + 1;
        pvVar2 = this->ops;
        ppOVar1 = (pvVar2->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(pvVar2->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3
                              ));
    }
    if (ppOVar1 != (pointer)0x0) {
      operator_delete(ppOVar1);
    }
    operator_delete(pvVar2);
    return;
  }
  return;
}

Assistant:

ExprTree::~ExprTree(void)

{
  if (outvn != (VarnodeTpl *)0)
    delete outvn;
  if (ops != (vector<OpTpl *> *)0) {
    for(int4 i=0;i<ops->size();++i)
      delete (*ops)[i];
    delete ops;
  }
}